

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O3

bool __thiscall SMBusAnalyzer::GetSignal(SMBusAnalyzer *this,SMBusSignalState *state)

{
  char cVar1;
  int iVar2;
  AnalyzerChannelData *pAVar3;
  long lVar4;
  U64 UVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  while( true ) {
    state->sample_marker = 0;
    state->sample_rising_clk = 0;
    state->sample_begin = 0;
    state->sample_end = 0;
    state->bus_signal = SMB_Undefined;
    pAVar3 = GetNearestTransitionChannel(this);
    iVar2 = AnalyzerChannelData::GetBitState();
    if (iVar2 == 1) {
      lVar4 = AnalyzerChannelData::GetSampleNumber();
      if (pAVar3 == this->mSMBDAT) {
        lVar6 = AnalyzerChannelData::GetSampleNumber();
        UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
        state->sample_marker = UVar5;
        iVar2 = AnalyzerChannelData::GetBitState();
        state->bus_signal = (uint)(iVar2 != 1);
        pAVar3 = AdvanceAllTo(this,state->sample_marker);
        cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
        if (cVar1 == '\0') {
          UVar5 = state->sample_marker;
          uVar8 = UVar5 - lVar6;
        }
        else {
          lVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
          UVar5 = state->sample_marker;
          uVar8 = UVar5 - lVar4;
          if (lVar6 - UVar5 < UVar5 - lVar4) {
            uVar8 = lVar6 - UVar5;
          }
          uVar8 = uVar8 >> 1;
        }
        state->sample_begin = UVar5 - uVar8;
        state->sample_end = UVar5 + uVar8;
        if ((state->bus_signal == SMB_Start) && (pAVar3 == this->mSMBCLK)) {
          UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
          AdvanceAllTo(this,UVar5);
        }
        return false;
      }
      UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
      pAVar3 = AdvanceAllTo(this,UVar5);
    }
    iVar2 = AnalyzerChannelData::GetBitState();
    if (iVar2 != 0) break;
    if (pAVar3 == this->mSMBDAT) {
      UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
      state->sample_begin = UVar5;
      pAVar3 = AdvanceAllTo(this,UVar5);
    }
    else {
      lVar4 = AnalyzerChannelData::GetSampleNumber();
      lVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
      state->sample_begin = (ulong)(lVar6 + lVar4) >> 1;
    }
    if (pAVar3 == this->mSMBCLK) {
      UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
      pAVar3 = AdvanceAllTo(this,UVar5);
      UVar5 = AnalyzerChannelData::GetSampleNumber();
      state->sample_rising_clk = UVar5;
      if (pAVar3 == this->mSMBCLK) {
        lVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
        uVar8 = lVar4 + state->sample_rising_clk >> 1;
        state->sample_marker = uVar8;
        if ((state->sample_rising_clk < uVar8) &&
           (uVar7 = AnalyzerChannelData::GetSampleOfNextEdge(), uVar8 < uVar7)) {
          AdvanceAllTo(this,state->sample_marker);
        }
        iVar2 = AnalyzerChannelData::GetBitState();
        state->bus_signal = iVar2 == 1 | SMB_Zero;
        UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
        pAVar3 = AdvanceAllTo(this,UVar5);
        if (pAVar3 == this->mSMBCLK) {
          lVar4 = AnalyzerChannelData::GetSampleNumber();
          lVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
          uVar8 = (ulong)(lVar6 + lVar4) >> 1;
        }
        else {
          uVar8 = AnalyzerChannelData::GetSampleOfNextEdge();
        }
        state->sample_end = uVar8;
        return true;
      }
    }
  }
  __assert_fail("mSMBCLK->GetBitState() == BIT_LOW",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusAnalyzer.cpp"
                ,0x8d,"bool SMBusAnalyzer::GetSignal(SMBusSignalState &)");
}

Assistant:

bool SMBusAnalyzer::GetSignal( SMBusSignalState& state )
{
func_begin:

    bool ret_val = true;

    state.Clear();

    AnalyzerChannelData* nearestEdgeChannel = GetNearestTransitionChannel();

    // first check for a start or stop
    if( mSMBCLK->GetBitState() == BIT_HIGH )
    {
        U64 start_sample = mSMBCLK->GetSampleNumber();
        if( nearestEdgeChannel == mSMBDAT )
        {
            ret_val = false;

            // remember where we began in case this is the last packet
            U64 frame_begin = mSMBDAT->GetSampleNumber();

            state.sample_marker = mSMBDAT->GetSampleOfNextEdge();

            if( mSMBDAT->GetBitState() == BIT_HIGH )
                state.bus_signal = SMB_Start;
            else
                state.bus_signal = SMB_Stop;

            // move all to the SMBDAT transition
            nearestEdgeChannel = AdvanceAllTo( state.sample_marker );

            // set the begin and ending samples for the frame
            U64 frame_offset = 0;
            if( nearestEdgeChannel->DoMoreTransitionsExistInCurrentData() )
            {
                U64 end_sample = nearestEdgeChannel->GetSampleOfNextEdge();
                if( end_sample - state.sample_marker < state.sample_marker - start_sample )
                    frame_offset = ( end_sample - state.sample_marker ) / 2;
                else
                    frame_offset = ( state.sample_marker - start_sample ) / 2;
            }
            else
            {
                frame_offset = state.sample_marker - frame_begin;
            }

            state.sample_begin = state.sample_marker - frame_offset;
            state.sample_end = state.sample_marker + frame_offset;

            // skip the falling SMBCLK if we have a start
            // this prepares us for the first bit
            if( state.bus_signal == SMB_Start && nearestEdgeChannel == mSMBCLK )
                AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );
        }
        else
        {
            // SMBCLK falls - skip to it
            nearestEdgeChannel = AdvanceAllTo( nearestEdgeChannel->GetSampleOfNextEdge() );
        }
    }

    // if we didn't find a start or stop above try parsing a bit
    if( ret_val )
    {
        // we must have a low SMBCLK at this point
        assert( mSMBCLK->GetBitState() == BIT_LOW );

        // skip the preparing of SMBDAT for the rising SMBCLK egde
        if( nearestEdgeChannel == mSMBDAT )
        {
            state.sample_begin = mSMBDAT->GetSampleOfNextEdge();
            nearestEdgeChannel = AdvanceAllTo( state.sample_begin );
        }
        else
        {
            state.sample_begin = ( mSMBCLK->GetSampleNumber() + mSMBCLK->GetSampleOfNextEdge() ) / 2;
        }

        // do we have a rising SMBCLK at this point?
        if( nearestEdgeChannel == mSMBCLK )
        {
            nearestEdgeChannel = AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );

            state.sample_rising_clk = mSMBCLK->GetSampleNumber();

            // do we have a falling SMBCLK edge next?
            if( nearestEdgeChannel == mSMBCLK )
            {
                // sample the state of SMBDAT
                state.sample_marker = ( mSMBCLK->GetSampleOfNextEdge() + state.sample_rising_clk ) / 2;

                if( state.sample_marker > state.sample_rising_clk && state.sample_marker < mSMBCLK->GetSampleOfNextEdge() )
                    nearestEdgeChannel = AdvanceAllTo( state.sample_marker );

                state.bus_signal = mSMBDAT->GetBitState() == BIT_HIGH ? SMB_One : SMB_Zero;

                // advance to SMBCLK falling edge
                nearestEdgeChannel = AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );

                // where to put the end of state depends on where the next transition happens
                if( nearestEdgeChannel == mSMBCLK )
                    state.sample_end = ( mSMBCLK->GetSampleNumber() + mSMBCLK->GetSampleOfNextEdge() ) / 2;
                else
                    state.sample_end = mSMBDAT->GetSampleOfNextEdge();
            }
            else
            {
                // go back to parsing start/stop
                goto func_begin;
            }
        }
        else
        {
            // go back to parsing start/stop
            goto func_begin;
        }
    }

    return ret_val;
}